

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AtmelSWIAnalyzerSettings.cpp
# Opt level: O0

void __thiscall
AtmelSWIAnalyzerSettings::LoadSettings(AtmelSWIAnalyzerSettings *this,char *settings)

{
  DecodeLevel local_30 [2];
  int temp_dl;
  SimpleArchive local_20 [8];
  SimpleArchive text_archive;
  char *settings_local;
  AtmelSWIAnalyzerSettings *this_local;
  
  _text_archive = settings;
  SimpleArchive::SimpleArchive(local_20);
  SimpleArchive::SetString((char *)local_20);
  SimpleArchive::operator>>(local_20,&this->mSDAChannel);
  SimpleArchive::operator>>(local_20,(int *)local_30);
  this->mDecodeLevel = local_30[0];
  AnalyzerSettings::ClearChannels();
  AnalyzerSettings::AddChannel((Channel *)this,(char *)&this->mSDAChannel,true);
  UpdateInterfacesFromSettings(this);
  SimpleArchive::~SimpleArchive(local_20);
  return;
}

Assistant:

void AtmelSWIAnalyzerSettings::LoadSettings( const char* settings )
{
    SimpleArchive text_archive;
    text_archive.SetString( settings );

    text_archive >> mSDAChannel;
    int temp_dl;
    text_archive >> temp_dl;
    mDecodeLevel = static_cast<DecodeLevel>( temp_dl );

    ClearChannels();

    AddChannel( mSDAChannel, CHANNEL_NAME, true );

    UpdateInterfacesFromSettings();
}